

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

string * __thiscall
despot::ChainState::text_abi_cxx11_(string *__return_storage_ptr__,ChainState *this)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  pointer pvVar5;
  pointer pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ostringstream oss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)local_1a8,this->mdp_state);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  pvVar5 = (this->mdp_transitions_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->mdp_transitions_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar6 != pvVar5) {
    uVar8 = 0;
    do {
      if (pvVar5[uVar8].
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          pvVar5[uVar8].
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar7 = 0;
        do {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)uVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ->",3);
          lVar1 = *(long *)&(this->mdp_transitions_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar1 + 8 + uVar7 * 0x18) != *(long *)(lVar1 + uVar7 * 0x18)) {
            uVar9 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
              std::ostream::_M_insert<double>
                        (*(double *)
                          (*(long *)(*(long *)&(this->mdp_transitions_).
                                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar7 * 0x18) +
                          uVar9 * 8));
              uVar9 = uVar9 + 1;
              lVar1 = *(long *)&(this->mdp_transitions_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data;
            } while (uVar9 < (ulong)(*(long *)(lVar1 + 8 + uVar7 * 0x18) -
                                     *(long *)(lVar1 + uVar7 * 0x18) >> 3));
          }
          cVar2 = (char)(ostringstream *)local_1a8;
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          pvVar5 = (this->mdp_transitions_).
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = uVar7 + 1;
          uVar9 = ((long)pvVar5[uVar8].
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pvVar5[uVar8].
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        } while (uVar7 <= uVar9 && uVar9 - uVar7 != 0);
        pvVar6 = (this->mdp_transitions_).
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
      uVar7 = ((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string ChainState::text() const {
	ostringstream oss;
	oss << mdp_state << endl;
	for (int s1 = 0; s1 < mdp_transitions_.size(); s1++) {
		for (int a = 0; a < mdp_transitions_[s1].size(); a++) {
			oss << s1 << " " << a << " ->";
			for (int s2 = 0; s2 < mdp_transitions_[s1][a].size(); s2++)
				oss << " " << mdp_transitions_[s1][a][s2];
			oss << endl;
		}
	}
	return oss.str();
}